

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontalbitpacking.cpp
# Opt level: O1

void FastPForLib::simdhunpack(uint8_t *in,uint32_t *out,uint32_t bit)

{
  undefined8 *puVar1;
  uint8_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  uint32_t j;
  long lVar6;
  logic_error *this;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  
  auVar30 = _DAT_00152980;
  auVar15 = _DAT_00152970;
  auVar22 = _DAT_00152950;
  auVar4 = _DAT_00152940;
  auVar3 = _DAT_00152930;
  auVar26 = _DAT_00152920;
  auVar32 = _DAT_00152910;
  auVar35 = _DAT_00152900;
  auVar27 = _DAT_001528e0;
  auVar13 = _DAT_001528c0;
  auVar29 = _DAT_001528b0;
  auVar34 = _DAT_00152890;
  auVar36 = _DAT_00152870;
  auVar42 = _DAT_00152850;
  auVar48 = _DAT_00152830;
  auVar7 = _DAT_00152810;
  auVar44 = _DAT_00152800;
  auVar45 = _DAT_001527d0;
  auVar40 = _DAT_001527b0;
  auVar25 = _DAT_00152790;
  auVar12 = _DAT_00152780;
  auVar14 = _DAT_00152740;
  switch(bit) {
  case 0:
    auVar41 = ZEXT1664((undefined1  [16])0x0);
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])(out + 0x70) = auVar37;
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])(out + 0x60) = auVar37;
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])(out + 0x50) = auVar37;
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])(out + 0x40) = auVar37;
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])(out + 0x30) = auVar37;
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])(out + 0x20) = auVar37;
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])(out + 0x10) = auVar37;
    auVar37 = vmovdqu64_avx512f(auVar41);
    *(undefined1 (*) [64])out = auVar37;
    break;
  case 1:
    lVar6 = 0;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar11._8_8_ = 0x100000001;
    auVar11._0_8_ = 0x100000001;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    do {
      uVar2 = in[lVar6];
      auVar38[1] = uVar2;
      auVar38[0] = uVar2;
      auVar38[2] = uVar2;
      auVar38[3] = uVar2;
      auVar38[4] = uVar2;
      auVar38[5] = uVar2;
      auVar38[6] = uVar2;
      auVar38[7] = uVar2;
      auVar38[8] = uVar2;
      auVar38[9] = uVar2;
      auVar38[10] = uVar2;
      auVar38[0xb] = uVar2;
      auVar38[0xc] = uVar2;
      auVar38[0xd] = uVar2;
      auVar38[0xe] = uVar2;
      auVar38[0xf] = uVar2;
      auVar25 = vpsrlvd_avx2(auVar38,auVar14);
      auVar25 = vpand_avx(auVar25,auVar11);
      *(undefined1 (*) [16])out = auVar25;
      uVar2 = in[lVar6];
      auVar39[1] = uVar2;
      auVar39[0] = uVar2;
      auVar39[2] = uVar2;
      auVar39[3] = uVar2;
      auVar39[4] = uVar2;
      auVar39[5] = uVar2;
      auVar39[6] = uVar2;
      auVar39[7] = uVar2;
      auVar39[8] = uVar2;
      auVar39[9] = uVar2;
      auVar39[10] = uVar2;
      auVar39[0xb] = uVar2;
      auVar39[0xc] = uVar2;
      auVar39[0xd] = uVar2;
      auVar39[0xe] = uVar2;
      auVar39[0xf] = uVar2;
      auVar25 = vpsrlvd_avx2(auVar39,auVar12);
      auVar25 = vpand_avx(auVar25,auVar11);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    break;
  case 2:
    lVar6 = 0;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar10._8_8_ = 0x300000003;
    auVar10._0_8_ = 0x300000003;
    do {
      uVar2 = in[lVar6 * 2];
      auVar20[1] = uVar2;
      auVar20[0] = uVar2;
      auVar20[2] = uVar2;
      auVar20[3] = uVar2;
      auVar20[4] = uVar2;
      auVar20[5] = uVar2;
      auVar20[6] = uVar2;
      auVar20[7] = uVar2;
      auVar20[8] = uVar2;
      auVar20[9] = uVar2;
      auVar20[10] = uVar2;
      auVar20[0xb] = uVar2;
      auVar20[0xc] = uVar2;
      auVar20[0xd] = uVar2;
      auVar20[0xe] = uVar2;
      auVar20[0xf] = uVar2;
      auVar12 = vpsrlvd_avx2(auVar20,auVar14);
      auVar12 = vpand_avx(auVar12,auVar10);
      *(undefined1 (*) [16])out = auVar12;
      uVar2 = in[lVar6 * 2 + 1];
      auVar21[1] = uVar2;
      auVar21[0] = uVar2;
      auVar21[2] = uVar2;
      auVar21[3] = uVar2;
      auVar21[4] = uVar2;
      auVar21[5] = uVar2;
      auVar21[6] = uVar2;
      auVar21[7] = uVar2;
      auVar21[8] = uVar2;
      auVar21[9] = uVar2;
      auVar21[10] = uVar2;
      auVar21[0xb] = uVar2;
      auVar21[0xc] = uVar2;
      auVar21[0xd] = uVar2;
      auVar21[0xe] = uVar2;
      auVar21[0xf] = uVar2;
      auVar12 = vpsrlvd_avx2(auVar21,auVar14);
      auVar12 = vpand_avx(auVar12,auVar10);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    break;
  case 3:
    lVar6 = 1;
    auVar25 = vpmovzxwd_avx(ZEXT816(0x8001010080008000));
    auVar14 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar23._8_8_ = 0x700000007;
    auVar23._0_8_ = 0x700000007;
    auVar40 = vpmovzxwd_avx(ZEXT816(0x8001800101008000));
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020704));
    do {
      auVar45 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -1),auVar25);
      auVar45 = vpsrlvd_avx2(auVar45,auVar14);
      auVar45 = vpand_avx(auVar45,auVar23);
      *(undefined1 (*) [16])out = auVar45;
      auVar45 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar40);
      auVar45 = vpsrlvd_avx2(auVar45,auVar12);
      auVar45 = vpand_avx(auVar45,auVar23);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar45;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 3;
    } while (lVar6 != 0x31);
    break;
  case 4:
    lVar6 = 0;
    auVar14 = vpmovsxbw_avx(ZEXT816(0x301030101000100));
    auVar8._8_8_ = 0x400000000;
    auVar8._0_8_ = 0x400000000;
    auVar17._8_8_ = 0xf0000000f;
    auVar17._0_8_ = 0xf0000000f;
    do {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar14);
      auVar12 = vpsrlvd_avx2(auVar12,auVar8);
      auVar12 = vpand_avx(auVar12,auVar17);
      *(undefined1 (*) [16])(out + lVar6 * 2) = auVar12;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + 2),auVar14);
      auVar12 = vpsrlvd_avx2(auVar12,auVar8);
      auVar12 = vpand_avx(auVar12,auVar17);
      *(undefined1 (*) [16])(out + lVar6 * 2 + 4) = auVar12;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x40);
    break;
  case 5:
    lVar6 = 2;
    auVar25 = vpmovzxwd_avx(ZEXT816(0x201800101008000));
    auVar14 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar28._8_8_ = 0x1f0000001f;
    auVar28._0_8_ = 0x1f0000001f;
    auVar40 = vpmovzxwd_avx(ZEXT816(0x8002020180010100));
    auVar12 = vpmovsxbd_avx(ZEXT416(0x3060104));
    do {
      auVar45 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -2),auVar25);
      auVar45 = vpsrlvd_avx2(auVar45,auVar14);
      auVar45 = vpand_avx(auVar45,auVar28);
      *(undefined1 (*) [16])out = auVar45;
      auVar45 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar40);
      auVar45 = vpsrlvd_avx2(auVar45,auVar12);
      auVar45 = vpand_avx(auVar45,auVar28);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar45;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 5;
    } while (lVar6 != 0x52);
    break;
  case 6:
    lVar6 = 3;
    auVar12 = vpmovzxwd_avx(ZEXT816(0x8002020101008000));
    auVar14 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar31._8_8_ = 0x3f0000003f;
    auVar31._0_8_ = 0x3f0000003f;
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -3),auVar12);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar31);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar12);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar31);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 6;
    } while (lVar6 != 99);
    break;
  case 7:
    lVar6 = 3;
    auVar25 = vpmovzxwd_avx(ZEXT816(0x302020101008000));
    auVar14 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar24._8_8_ = 0x7f0000007f;
    auVar24._0_8_ = 0x7f0000007f;
    auVar40 = vpmovzxwd_avx(ZEXT816(0x8003030202010100));
    auVar12 = vpmovsxbd_avx(ZEXT416(0x1020304));
    do {
      auVar45 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -3),auVar25);
      auVar45 = vpsrlvd_avx2(auVar45,auVar14);
      auVar45 = vpand_avx(auVar45,auVar24);
      *(undefined1 (*) [16])out = auVar45;
      auVar45 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar40);
      auVar45 = vpsrlvd_avx2(auVar45,auVar12);
      auVar45 = vpand_avx(auVar45,auVar24);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar45;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 7;
    } while (lVar6 != 0x73);
    break;
  case 8:
    lVar6 = 0;
    do {
      auVar14 = vpmovzxbd_avx(ZEXT416(*(uint *)(in + lVar6)));
      *(undefined1 (*) [16])(out + lVar6) = auVar14;
      auVar14 = vpmovzxbd_avx(ZEXT416(*(uint *)(in + lVar6 + 4)));
      *(undefined1 (*) [16])(out + lVar6 + 4) = auVar14;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x80);
    break;
  case 9:
    lVar6 = 4;
    auVar25 = vpmovsxwd_avx(ZEXT816(0x403030202010100));
    auVar14 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar19._8_8_ = 0x1ff000001ff;
    auVar19._0_8_ = 0x1ff000001ff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    do {
      auVar40 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -4),auVar25);
      auVar40 = vpsrlvd_avx2(auVar40,auVar14);
      auVar40 = vpand_avx(auVar40,auVar19);
      *(undefined1 (*) [16])out = auVar40;
      auVar40 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar25);
      auVar40 = vpsrlvd_avx2(auVar40,auVar12);
      auVar40 = vpand_avx(auVar40,auVar19);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar40;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 9;
    } while (lVar6 != 0x94);
    break;
  case 10:
    lVar6 = 5;
    auVar12 = vpmovsxwd_avx(ZEXT816(0x403030202010100));
    auVar14 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar33._8_8_ = 0x3ff000003ff;
    auVar33._0_8_ = 0x3ff000003ff;
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -5),auVar12);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar33);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar12);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar33);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 10;
    } while (lVar6 != 0xa5);
    break;
  case 0xb:
    lVar6 = 5;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar16._8_8_ = 0x7ff000007ff;
    auVar16._0_8_ = 0x7ff000007ff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020704));
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -5),auVar15);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar16);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar30);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar16);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0xb;
    } while (lVar6 != 0xb5);
    break;
  case 0xc:
    lVar6 = 6;
    auVar14 = vpmovsxwd_avx(ZEXT816(0x504040302010100));
    auVar9._8_8_ = 0x400000000;
    auVar9._0_8_ = 0x400000000;
    auVar18._8_8_ = 0xfff00000fff;
    auVar18._0_8_ = 0xfff00000fff;
    do {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -6),auVar14);
      auVar12 = vpsrlvd_avx2(auVar12,auVar9);
      auVar12 = vpand_avx(auVar12,auVar18);
      *(undefined1 (*) [16])out = auVar12;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar14);
      auVar12 = vpsrlvd_avx2(auVar12,auVar9);
      auVar12 = vpand_avx(auVar12,auVar18);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0xc6);
    break;
  case 0xd:
    lVar6 = 6;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar30._8_8_ = 0x1fff00001fff;
    auVar30._0_8_ = 0x1fff00001fff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x3060104));
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -6),auVar4);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar30);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar22);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar30);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0xd;
    } while (lVar6 != 0xd6);
    break;
  case 0xe:
    lVar6 = 7;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar15._8_8_ = 0x3fff00003fff;
    auVar15._0_8_ = 0x3fff00003fff;
    do {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -7),auVar3);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar15);
      *(undefined1 (*) [16])out = auVar12;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar3);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar15);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0xe;
    } while (lVar6 != 0xe7);
    break;
  case 0xf:
    lVar6 = 7;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar22._8_8_ = 0x7fff00007fff;
    auVar22._0_8_ = 0x7fff00007fff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x1020304));
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -7),auVar32);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar22);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar26);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar22);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0xf;
    } while (lVar6 != 0xf7);
    break;
  case 0x10:
    lVar6 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(in + lVar6);
      auVar14 = vpmovzxwd_avx(auVar3);
      *(undefined1 (*) [16])((long)out + lVar6 * 2) = auVar14;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(in + lVar6 + 8);
      auVar14 = vpmovzxwd_avx(auVar4);
      *(undefined1 (*) [16])((long)out + lVar6 * 2 + 0x10) = auVar14;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x100);
    break;
  case 0x11:
    lVar6 = 8;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar26._8_8_ = 0x1ffff0001ffff;
    auVar26._0_8_ = 0x1ffff0001ffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -8),auVar35);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar26);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar35);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar26);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x11;
    } while (lVar6 != 0x118);
    break;
  case 0x12:
    lVar6 = 9;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar32._8_8_ = 0x3ffff0003ffff;
    auVar32._0_8_ = 0x3ffff0003ffff;
    do {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -9),auVar35);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar32);
      *(undefined1 (*) [16])out = auVar12;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar35);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar32);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x12;
    } while (lVar6 != 0x129);
    break;
  case 0x13:
    lVar6 = 9;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x1060300));
    auVar35._8_8_ = 0x7ffff0007ffff;
    auVar35._0_8_ = 0x7ffff0007ffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020704));
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -9),auVar13);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar35);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar27);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar35);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x13;
    } while (lVar6 != 0x139);
    break;
  case 0x14:
    lVar6 = 10;
    auVar13._8_8_ = 0x400000000;
    auVar13._0_8_ = 0x400000000;
    auVar27._8_8_ = 0xfffff000fffff;
    auVar27._0_8_ = 0xfffff000fffff;
    do {
      auVar14 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -10),auVar29);
      auVar14 = vpsrlvd_avx2(auVar14,auVar13);
      auVar14 = vpand_avx(auVar14,auVar27);
      *(undefined1 (*) [16])out = auVar14;
      auVar14 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar29);
      auVar14 = vpsrlvd_avx2(auVar14,auVar13);
      auVar14 = vpand_avx(auVar14,auVar27);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar14;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x14;
    } while (lVar6 != 0x14a);
    break;
  case 0x15:
    lVar6 = 10;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x7020500));
    auVar29._8_8_ = 0x1fffff001fffff;
    auVar29._0_8_ = 0x1fffff001fffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x3060104));
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -10),auVar36);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar29);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar34);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar29);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x15;
    } while (lVar6 != 0x15a);
    break;
  case 0x16:
    lVar6 = 0xb;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x2040600));
    auVar34._8_8_ = 0x3fffff003fffff;
    auVar34._0_8_ = 0x3fffff003fffff;
    do {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xb),auVar42);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar34);
      *(undefined1 (*) [16])out = auVar12;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar42);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar34);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x16;
    } while (lVar6 != 0x16b);
    break;
  case 0x17:
    lVar6 = 0xb;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x5060700));
    auVar36._8_8_ = 0x7fffff007fffff;
    auVar36._0_8_ = 0x7fffff007fffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x1020304));
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xb),auVar7);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar36);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar48);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar36);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x17;
    } while (lVar6 != 0x17b);
    break;
  case 0x18:
    lVar6 = 0xc;
    do {
      auVar14 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xc),auVar44);
      *(undefined1 (*) [16])out = auVar14;
      auVar14 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar44);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar14;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x18c);
    break;
  case 0x19:
    lVar6 = 0xc;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar48._8_8_ = 0x1ffffff01ffffff;
    auVar48._0_8_ = 0x1ffffff01ffffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x7060504));
    auVar42._8_4_ = 0x1ffffff;
    auVar42._0_8_ = 0x1ffffff01ffffff;
    auVar42._12_4_ = 0x1ffffff;
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xc),auVar45);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar48);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar45);
      auVar25 = vpsrlvd_avx2(auVar25,auVar12);
      auVar25 = vpand_avx(auVar25,auVar42);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x19;
    } while (lVar6 != 0x19c);
    break;
  case 0x1a:
    lVar6 = 0xd;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x6040200));
    auVar7._8_4_ = 0x3ffffff;
    auVar7._0_8_ = 0x3ffffff03ffffff;
    auVar7._12_4_ = 0x3ffffff;
    do {
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xd),auVar45);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar7);
      *(undefined1 (*) [16])out = auVar12;
      auVar12 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar45);
      auVar12 = vpsrlvd_avx2(auVar12,auVar14);
      auVar12 = vpand_avx(auVar12,auVar7);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x1a;
    } while (lVar6 != 0x1ad);
    break;
  case 0x1b:
    lVar6 = 0xd;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x1000300));
    auVar45._8_8_ = 0x7ffffff07ffffff;
    auVar45._0_8_ = 0x7ffffff07ffffff;
    auVar12 = vpmovsxbd_avx(ZEXT416(0x5020004));
    auVar44._8_4_ = 0x7ffffff;
    auVar44._0_8_ = 0x7ffffff07ffffff;
    auVar44._12_4_ = 0x7ffffff;
    do {
      auVar7 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xd),auVar25);
      auVar48 = vpsrlq_avx(auVar7,6);
      auVar7 = vpblendd_avx2(auVar7,auVar48,4);
      auVar7 = vpsrlvd_avx2(auVar7,auVar14);
      auVar7 = vpand_avx(auVar7,auVar45);
      *(undefined1 (*) [16])out = auVar7;
      auVar7 = *(undefined1 (*) [16])(in + lVar6);
      auVar48 = vpaddq_avx(auVar7,auVar7);
      auVar7 = vpermt2b_avx512vl(auVar7,auVar40,auVar48);
      auVar7 = vpsrlvd_avx2(auVar7,auVar12);
      auVar7 = vpand_avx(auVar7,auVar44);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar7;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x1b;
    } while (lVar6 != 0x1bd);
    break;
  case 0x1c:
    lVar6 = 0xe;
    auVar14._8_8_ = 0x400000000;
    auVar14._0_8_ = 0x400000000;
    auVar40._8_4_ = 0xfffffff;
    auVar40._0_8_ = 0xfffffff0fffffff;
    auVar40._12_4_ = 0xfffffff;
    do {
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xe),auVar12);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar40);
      *(undefined1 (*) [16])out = auVar25;
      auVar25 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar12);
      auVar25 = vpsrlvd_avx2(auVar25,auVar14);
      auVar25 = vpand_avx(auVar25,auVar40);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar25;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x1c;
    } while (lVar6 != 0x1ce);
    break;
  case 0x1d:
    lVar6 = 0xe;
    auVar14 = vpmovsxbd_avx(ZEXT416(0x2020000));
    auVar37 = ZEXT1664(auVar14);
    auVar41 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
    auVar43 = ZEXT1664(_DAT_00152760);
    auVar14 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar46 = ZEXT1664(auVar14);
    auVar47 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
    do {
      auVar14 = *(undefined1 (*) [16])(in + lVar6 + -0xe);
      if (simdhunpack29(unsigned_char_const*,unsigned_int*)::x2 == '\0') {
        simdhunpack();
        auVar47 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
        auVar12 = vpmovsxbd_avx(ZEXT416(0x3020100));
        auVar46 = ZEXT1664(auVar12);
        auVar43 = ZEXT1664(_DAT_00152760);
        auVar41 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
        auVar12 = vpmovsxbd_avx(ZEXT416(0x2020000));
        auVar37 = ZEXT1664(auVar12);
      }
      auVar12 = vpsllq_avx(auVar14,3);
      auVar12 = vpblendw_avx(auVar12,auVar14,0x13);
      auVar12 = vpshufb_avx(auVar12,simdhunpack29(unsigned_char_const*,unsigned_int*)::x2);
      if (simdhunpack29(unsigned_char_const*,unsigned_int*)::x1 == '\0') {
        simdhunpack();
        auVar47 = ZEXT1664(CONCAT412(0x1fffffff,CONCAT48(0x1fffffff,0x1fffffff1fffffff)));
        auVar25 = vpmovsxbd_avx(ZEXT416(0x3020100));
        auVar46 = ZEXT1664(auVar25);
        auVar43 = ZEXT1664(_DAT_00152760);
        auVar41 = ZEXT1664(CONCAT88(0x1fffffff1fffffff,0x1fffffff1fffffff));
        auVar25 = vpmovsxbd_avx(ZEXT416(0x2020000));
        auVar37 = ZEXT1664(auVar25);
      }
      auVar14 = vpshufb_avx(auVar14,simdhunpack29(unsigned_char_const*,unsigned_int*)::x1);
      auVar14 = vpblendd_avx2(auVar14,auVar12,10);
      auVar14 = vpsrlvd_avx2(auVar14,auVar37._0_16_);
      auVar14 = vpand_avx(auVar14,auVar41._0_16_);
      *(undefined1 (*) [16])out = auVar14;
      auVar14 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar43._0_16_);
      auVar12 = vpsrlq_avx(auVar14,4);
      auVar14 = vpblendd_avx2(auVar12,auVar14,10);
      auVar14 = vpsrlvd_avx2(auVar14,auVar46._0_16_);
      auVar14 = vpand_avx(auVar14,auVar47._0_16_);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar14;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x1d;
    } while (lVar6 != 0x1de);
    break;
  case 0x1e:
    lVar6 = 0xf;
    auVar12._8_8_ = 0x200000000;
    auVar12._0_8_ = 0x200000000;
    auVar25._8_4_ = 0x3fffffff;
    auVar25._0_8_ = 0x3fffffff3fffffff;
    auVar25._12_4_ = 0x3fffffff;
    do {
      auVar40 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6 + -0xf),auVar14);
      auVar45 = vpsrlq_avx(auVar40,4);
      auVar40 = vpblendd_avx2(auVar40,auVar45,4);
      auVar45 = vpsllq_avx(*(undefined1 (*) [16])(in + lVar6 + -0xf),4);
      auVar40 = vpblendd_avx2(auVar40,auVar45,2);
      auVar40 = vpsrlvd_avx2(auVar40,auVar12);
      auVar40 = vpand_avx(auVar40,auVar25);
      *(undefined1 (*) [16])out = auVar40;
      auVar40 = vpshufb_avx(*(undefined1 (*) [16])(in + lVar6),auVar14);
      auVar45 = vpsrlq_avx(auVar40,4);
      auVar40 = vpblendd_avx2(auVar40,auVar45,4);
      auVar45 = vpsllq_avx(*(undefined1 (*) [16])(in + lVar6),4);
      auVar40 = vpblendd_avx2(auVar40,auVar45,2);
      auVar40 = vpsrlvd_avx2(auVar40,auVar12);
      auVar40 = vpand_avx(auVar40,auVar25);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar40;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x1e;
    } while (lVar6 != 0x1ef);
    break;
  case 0x1f:
    if (simdhunpack31(unsigned_char_const*,unsigned_int*)::mask == '\0') {
      simdhunpack();
    }
    auVar14 = simdhunpack31(unsigned_char_const*,unsigned_int*)::mask;
    lVar6 = 0xf;
    do {
      auVar12 = *(undefined1 (*) [16])(in + lVar6 + -0xf);
      auVar25 = vpaddq_avx(auVar12,auVar12);
      auVar25 = vpblendd_avx2(auVar12,auVar25,2);
      auVar40 = vpslldq_avx(auVar12,1);
      auVar40 = vpsrlq_avx(auVar40,6);
      auVar25 = vpblendd_avx2(auVar25,auVar40,0xc);
      auVar12 = vpsllq_avx(auVar12,3);
      auVar12 = vpblendd_avx2(auVar25,auVar12,8);
      auVar12 = vpand_avx(auVar14,auVar12);
      *(undefined1 (*) [16])out = auVar12;
      auVar12 = *(undefined1 (*) [16])(in + lVar6);
      auVar25 = vpsrlq_avx(auVar12,4);
      auVar40 = vpsrldq_avx(auVar12,1);
      auVar40 = vpsllq_avx(auVar40,5);
      auVar25 = vpblendd_avx2(auVar25,auVar40,2);
      auVar40 = vpsrlq_avx(auVar12,2);
      auVar25 = vpblendd_avx2(auVar25,auVar40,0xc);
      auVar12 = vpsrlq_avx(auVar12,1);
      auVar12 = vpblendd_avx2(auVar25,auVar12,8);
      auVar12 = vpand_avx(auVar14,auVar12);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
      out = (uint32_t *)((long)out + 0x20);
      lVar6 = lVar6 + 0x1f;
    } while (lVar6 != 0x1ff);
    break;
  case 0x20:
    lVar6 = 0;
    do {
      uVar5 = *(undefined8 *)(in + lVar6 + 8);
      *(undefined8 *)((long)out + lVar6) = *(undefined8 *)(in + lVar6);
      ((undefined8 *)((long)out + lVar6))[1] = uVar5;
      uVar5 = *(undefined8 *)(in + lVar6 + 0x10 + 8);
      puVar1 = (undefined8 *)((long)out + lVar6 + 0x10);
      *puVar1 = *(undefined8 *)(in + lVar6 + 0x10);
      puVar1[1] = uVar5;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x200);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void simdhunpack(const uint8_t *in, uint32_t *out, uint32_t bit) {
  switch (bit) {
  case 0:
    SIMD_nullunpacker32(in, out);
    return;

  case 1:
    simdhunpack1(in, out);
    return;

  case 2:
    simdhunpack2(in, out);
    return;

  case 3:
    simdhunpack3(in, out);
    return;

  case 4:
    simdhunpack4(in, out);
    return;

  case 5:
    simdhunpack5(in, out);
    return;

  case 6:
    simdhunpack6(in, out);
    return;

  case 7:
    simdhunpack7(in, out);
    return;

  case 8:
    simdhunpack8(in, out);
    return;

  case 9:
    simdhunpack9(in, out);
    return;

  case 10:
    simdhunpack10(in, out);
    return;

  case 11:
    simdhunpack11(in, out);
    return;

  case 12:
    simdhunpack12(in, out);
    return;

  case 13:
    simdhunpack13(in, out);
    return;

  case 14:
    simdhunpack14(in, out);
    return;

  case 15:
    simdhunpack15(in, out);
    return;

  case 16:
    simdhunpack16(in, out);
    return;

  case 17:
    simdhunpack17(in, out);
    return;

  case 18:
    simdhunpack18(in, out);
    return;

  case 19:
    simdhunpack19(in, out);
    return;

  case 20:
    simdhunpack20(in, out);
    return;

  case 21:
    simdhunpack21(in, out);
    return;

  case 22:
    simdhunpack22(in, out);
    return;

  case 23:
    simdhunpack23(in, out);
    return;

  case 24:
    simdhunpack24(in, out);
    return;

  case 25:
    simdhunpack25(in, out);
    return;

  case 26:
    simdhunpack26(in, out);
    return;

  case 27:
    simdhunpack27(in, out);
    return;

  case 28:
    simdhunpack28(in, out);
    return;

  case 29:
    simdhunpack29(in, out);
    return;

  case 30:
    simdhunpack30(in, out);
    return;

  case 31:
    simdhunpack31(in, out);
    return;

  case 32:
    simdhunpack32(in, out);
    return;

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}